

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

void __thiscall crypto::xchacha20::discard(xchacha20 *this,size_t length)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  ulong in_RSI;
  word *in_RDI;
  size_t remaining;
  xchacha20 *in_stack_ffffffffffffffe0;
  ulong local_10 [2];
  
  local_10[0] = in_RSI;
  if ((char)in_RDI[0x20] != '@') {
    in_stack_ffffffffffffffe0 = (xchacha20 *)(0x40 - (ulong)(byte)in_RDI[0x20]);
    puVar2 = std::min<unsigned_long>(local_10,(unsigned_long *)&stack0xffffffffffffffe0);
    uVar1 = *puVar2;
    *(char *)(in_RDI + 0x20) = (char)in_RDI[0x20] + (char)uVar1;
    local_10[0] = local_10[0] - uVar1;
  }
  increment_count(in_RDI,local_10[0] >> 6);
  if ((local_10[0] & 0x3f) != 0) {
    update(in_stack_ffffffffffffffe0);
    *(byte *)(in_RDI + 0x20) = (byte)local_10[0] & 0x3f;
  }
  return;
}

Assistant:

void xchacha20::discard(size_t length) {
	
	// asume pos > 0 && pos <= sizeof(keystream)
	
	if(pos != sizeof(keystream)) {
		size_t remaining = std::min(length, size_t(64) - size_t(pos));
		pos = boost::uint8_t(pos + remaining);
		length -= remaining;
	}
	
	// assert length == 0 || pos == sizeof(keystream)
	
	increment_count(state, length / sizeof(keystream));
	
	if(length % sizeof(keystream)) {
		update();
		pos = boost::uint8_t(length % sizeof(keystream));
	}
	
}